

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Parser::IncludePath>::Inserter::insertOne
          (Inserter *this,qsizetype pos,IncludePath *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  IncludePath *pIVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  IncludePath *pIVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pIVar3 = this->begin;
  lVar11 = this->size;
  pIVar7 = pIVar3 + lVar11;
  this->end = pIVar7;
  this->last = pIVar3 + lVar11 + -1;
  lVar11 = lVar11 - pos;
  this->where = pIVar3 + pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (lVar11 < 1) {
    this->sourceCopyConstruct = 1 - lVar11;
    this->move = 0;
    this->sourceCopyAssign = lVar11;
  }
  if (this->sourceCopyConstruct != 0) {
    pDVar4 = (t->path).d.d;
    (t->path).d.d = (Data *)0x0;
    (pIVar7->path).d.d = pDVar4;
    pcVar5 = (t->path).d.ptr;
    (t->path).d.ptr = (char *)0x0;
    (pIVar7->path).d.ptr = pcVar5;
    qVar6 = (t->path).d.size;
    (t->path).d.size = 0;
    (pIVar7->path).d.size = qVar6;
    pIVar7->isFrameworkPath = t->isFrameworkPath;
    this->size = this->size + 1;
    return;
  }
  pDVar4 = pIVar7[-1].path.d.d;
  pcVar5 = pIVar7[-1].path.d.ptr;
  pIVar7[-1].path.d.d = (Data *)0x0;
  pIVar7[-1].path.d.ptr = (char *)0x0;
  (pIVar7->path).d.d = pDVar4;
  (pIVar7->path).d.ptr = pcVar5;
  qVar6 = pIVar7[-1].path.d.size;
  pIVar7[-1].path.d.size = 0;
  (pIVar7->path).d.size = qVar6;
  pIVar7->isFrameworkPath = pIVar7[-1].isFrameworkPath;
  this->size = this->size + 1;
  if (this->move != 0) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      pIVar7 = this->last;
      puVar1 = (undefined8 *)((long)&(pIVar7->path).d.d + lVar11);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pIVar7[-1].path.d.d + lVar11);
      uVar10 = puVar2[1];
      puVar1 = (undefined8 *)((long)&(pIVar7->path).d.d + lVar11);
      *puVar1 = *puVar2;
      puVar1[1] = uVar10;
      puVar1 = (undefined8 *)((long)&pIVar7[-1].path.d.d + lVar11);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pIVar7->path).d.size + lVar11);
      *(undefined8 *)((long)&(pIVar7->path).d.size + lVar11) =
           *(undefined8 *)((long)pIVar7 + lVar11 + -0x10);
      *(undefined8 *)((long)pIVar7 + lVar11 + -0x10) = uVar8;
      (&pIVar7->isFrameworkPath)[lVar11] = *(bool *)((long)pIVar7 + lVar11 + -8);
      lVar12 = lVar12 + -1;
      lVar11 = lVar11 + -0x20;
    } while (lVar12 != this->move);
  }
  pIVar7 = this->where;
  pDVar4 = (pIVar7->path).d.d;
  (pIVar7->path).d.d = (t->path).d.d;
  (t->path).d.d = pDVar4;
  pcVar5 = (pIVar7->path).d.ptr;
  (pIVar7->path).d.ptr = (t->path).d.ptr;
  (t->path).d.ptr = pcVar5;
  qVar6 = (pIVar7->path).d.size;
  (pIVar7->path).d.size = (t->path).d.size;
  (t->path).d.size = qVar6;
  pIVar7->isFrameworkPath = t->isFrameworkPath;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }